

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ed25519_asn1.cc
# Opt level: O2

int ed25519_get_priv_raw(EVP_PKEY *pkey,uint8_t *out,size_t *out_len)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int reason;
  int iVar5;
  int line;
  
  puVar1 = (undefined8 *)pkey->pkey;
  if (*(char *)(puVar1 + 8) == '\0') {
    line = 0x4e;
    reason = 0x82;
LAB_0018160f:
    iVar5 = 0;
    ERR_put_error(6,0,reason,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ed25519_asn1.cc"
                  ,line);
  }
  else {
    if (out != (uint8_t *)0x0) {
      if (*out_len < 0x20) {
        reason = 100;
        line = 0x58;
        goto LAB_0018160f;
      }
      uVar2 = *puVar1;
      uVar3 = puVar1[1];
      uVar4 = puVar1[3];
      *(undefined8 *)(out + 0x10) = puVar1[2];
      *(undefined8 *)(out + 0x18) = uVar4;
      *(undefined8 *)out = uVar2;
      *(undefined8 *)(out + 8) = uVar3;
    }
    *out_len = 0x20;
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

static int ed25519_get_priv_raw(const EVP_PKEY *pkey, uint8_t *out,
                                size_t *out_len) {
  const ED25519_KEY *key = reinterpret_cast<const ED25519_KEY *>(pkey->pkey);
  if (!key->has_private) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_NOT_A_PRIVATE_KEY);
    return 0;
  }

  if (out == NULL) {
    *out_len = 32;
    return 1;
  }

  if (*out_len < 32) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_BUFFER_TOO_SMALL);
    return 0;
  }

  // The raw private key format is the first 32 bytes of the private key.
  OPENSSL_memcpy(out, key->key, 32);
  *out_len = 32;
  return 1;
}